

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

string * __thiscall
soul::getInitialiserValue_abi_cxx11_(string *__return_storage_ptr__,soul *this,CodeLocation *name)

{
  SourceCodeText *o;
  Ptr PVar1;
  CodeLocationRange range;
  SourceCodeText *local_88;
  char *local_80;
  CodeLocationRange local_78;
  CodeLocation local_50;
  string local_40;
  CodeLocation local_20;
  
  local_78.end.sourceCode.object = (SourceCodeText *)0x0;
  local_78.end.location.data = (char *)0x0;
  local_78.start.sourceCode.object = (SourceCodeText *)0x0;
  local_78.start.location.data = (char *)0x0;
  o = *(SourceCodeText **)this;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_20.location.data = *(char **)(this + 8);
  local_20.sourceCode.object = o;
  SourceCodeUtilities::findNextOccurrence((SourceCodeUtilities *)&local_88,&local_20,'=');
  PVar1.object = local_78.start.sourceCode.object;
  if (local_88 != local_78.start.sourceCode.object) {
    local_78.start.sourceCode.object = local_88;
    local_88 = (SourceCodeText *)0x0;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PVar1.object);
  }
  local_78.start.location.data = local_80;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  if ((local_78.start.sourceCode.object != (SourceCodeText *)0x0) &&
     (((local_78.start.sourceCode.object)->content)._M_string_length != 0)) {
    UTF8Reader::operator++(&local_78.start.location);
    local_50.sourceCode.object = local_78.start.sourceCode.object;
    if (local_78.start.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_78.start.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_78.start.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_50.location.data = local_78.start.location.data;
    SourceCodeUtilities::findEndOfExpression((SourceCodeUtilities *)&local_88,&local_50);
    PVar1.object = local_78.end.sourceCode.object;
    if (local_88 != local_78.end.sourceCode.object) {
      local_78.end.sourceCode.object = local_88;
      local_88 = (SourceCodeText *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PVar1.object);
    }
    local_78.end.location.data = local_80;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.sourceCode.object);
    CodeLocationRange::toString_abi_cxx11_(&local_40,&local_78);
    choc::text::trim(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.end.sourceCode.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.start.sourceCode.object);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("! range.start.isEmpty()","getInitialiserValue",0x111);
}

Assistant:

static std::string getInitialiserValue (CodeLocation name)
{
    CodeLocationRange range;
    range.start = SourceCodeUtilities::findNextOccurrence (name, '=');
    SOUL_ASSERT (! range.start.isEmpty());
    ++(range.start.location);
    range.end = SourceCodeUtilities::findEndOfExpression (range.start);
    return choc::text::trim (range.toString());
}